

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexReader.cpp
# Opt level: O3

void __thiscall
Ptex::v2_2::PtexReader::readFaceData
          (PtexReader *this,FilePos pos,FaceDataHeader fdh,Res res,int levelid,FaceData **face)

{
  ushort uVar1;
  DataType DVar2;
  int iVar3;
  pointer ppFVar4;
  pointer pFVar5;
  pointer ppFVar6;
  pointer data;
  pointer plVar7;
  pthread_mutex_t *__mutex;
  int vw;
  uint32_t uw;
  undefined4 uVar8;
  TiledFace *pTVar9;
  PtexReader *pPVar10;
  undefined1 *puVar11;
  ulong uVar12;
  byte bVar13;
  undefined6 in_register_0000000a;
  uint zipsize;
  undefined1 *puVar14;
  pointer pFVar15;
  ulong uVar16;
  FilePos FVar17;
  long lVar18;
  int iVar19;
  uint uVar20;
  int iVar21;
  long lVar22;
  undefined1 auStack_78 [8];
  FaceData **local_70;
  PtexReader *local_68;
  pthread_mutex_t *local_60;
  int local_58;
  int local_54;
  uint32_t tileheadersize;
  int local_4c;
  TiledFace *local_48;
  uint local_40;
  Res local_3a;
  int local_38;
  undefined4 uStack_34;
  Res tileres;
  
  puVar14 = auStack_78;
  local_60 = (pthread_mutex_t *)&this->readlock;
  local_38 = levelid;
  pthread_mutex_lock(local_60);
  puVar11 = auStack_78;
  if (*face == (FaceData *)0x0) {
    uStack_34 = (undefined4)CONCAT62(in_register_0000000a,res);
    local_70 = face;
    local_40 = fdh.data;
    seek(this,pos);
    uVar8 = uStack_34;
    uVar20 = local_40 >> 0x1e;
    if (uVar20 - 1 < 2) {
      tileheadersize = 1 << ((byte)uStack_34 & 0x1f);
      bVar13 = (byte)((uint)uStack_34 >> 8);
      local_54 = 1 << (bVar13 & 0x1f);
      iVar21 = tileheadersize << (bVar13 & 0x1f);
      iVar19 = this->_pixelsize;
      local_68 = this;
      pTVar9 = (TiledFace *)operator_new(0x18);
      (pTVar9->super_TiledFaceBase).super_FaceData._res = SUB42(uVar8,0);
      (pTVar9->super_TiledFaceBase).super_FaceData.super_PtexFaceData._vptr_PtexFaceData =
           (_func_int **)&PTR__PackedFace_0012d790;
      *(int *)&(pTVar9->super_TiledFaceBase).super_FaceData.field_0xc = iVar19;
      iVar19 = iVar19 * iVar21;
      uVar16 = (ulong)iVar19;
      local_4c = iVar21;
      pPVar10 = (PtexReader *)operator_new__(uVar16);
      this = local_68;
      (pTVar9->super_TiledFaceBase)._reader = pPVar10;
      local_48 = pTVar9;
      if (iVar19 < 0x4001) {
        puVar11 = auStack_78 + -(uVar16 + 0xf & 0xfffffffffffffff0);
        puVar14 = puVar11;
      }
      else {
        puVar11 = (undefined1 *)operator_new__(uVar16);
        puVar14 = auStack_78;
      }
      zipsize = local_40 & 0x3fffffff;
      *(undefined8 *)(puVar14 + -8) = 0x113379;
      readZipBlock(this,puVar11,zipsize,iVar19);
      if (uVar20 == 2) {
        DVar2 = (this->_header).datatype;
        *(undefined8 *)(puVar14 + -8) = 0x113391;
        PtexUtils::decodeDifference(puVar11,iVar19,DVar2);
      }
      uw = tileheadersize;
      vw = local_54;
      uVar12 = (ulong)(this->_header).datatype;
      iVar21 = *(int *)(DataSize(Ptex::v2_2::DataType)::sizes + uVar12 * 4);
      bVar13 = (byte)uStack_34;
      iVar3 = this->_pixelsize;
      pPVar10 = (local_48->super_TiledFaceBase)._reader;
      *(ulong *)(puVar14 + -8) = (ulong)(this->_header).nchannels;
      *(ulong *)(puVar14 + -0x10) = uVar12;
      *(undefined8 *)(puVar14 + -0x18) = 0x1133d6;
      PtexUtils::interleave
                (puVar11,iVar21 << (bVar13 & 0x1f),uw,vw,pPVar10,iVar3 << (bVar13 & 0x1f),
                 *(DataType *)(puVar14 + -0x10),*(int *)(puVar14 + -8));
      iVar21 = local_4c;
      if ((local_38 == 0) && (this->_premultiply == true)) {
        iVar3 = (this->_header).alphachan;
        uVar1 = (this->_header).nchannels;
        if (iVar3 < (int)(uint)uVar1 && -1 < iVar3) {
          pPVar10 = (local_48->super_TiledFaceBase)._reader;
          DVar2 = (this->_header).datatype;
          *(undefined8 *)(puVar14 + -8) = 0x113420;
          PtexUtils::multalpha(pPVar10,iVar21,DVar2,(uint)uVar1,iVar3);
        }
      }
      lVar22 = uVar16 + 0x18;
      pTVar9 = local_48;
      if (0x4000 < iVar19) {
        *(undefined8 *)(puVar14 + -8) = 0x113435;
        operator_delete__(puVar11);
        pTVar9 = local_48;
      }
    }
    else if (local_40 >> 0x1e == 0) {
      pTVar9 = (TiledFace *)operator_new(0x18);
      iVar19 = this->_pixelsize;
      (pTVar9->super_TiledFaceBase).super_FaceData._res.ulog2 = '\0';
      (pTVar9->super_TiledFaceBase).super_FaceData._res.vlog2 = '\0';
      (pTVar9->super_TiledFaceBase).super_FaceData.super_PtexFaceData._vptr_PtexFaceData =
           (_func_int **)&PTR__PackedFace_0012d790;
      *(int *)&(pTVar9->super_TiledFaceBase).super_FaceData.field_0xc = iVar19;
      pPVar10 = (PtexReader *)operator_new__((long)iVar19);
      (pTVar9->super_TiledFaceBase)._reader = pPVar10;
      (pTVar9->super_TiledFaceBase).super_FaceData.super_PtexFaceData._vptr_PtexFaceData =
           (_func_int **)&PTR__PackedFace_0012d810;
      readBlock(this,pPVar10,iVar19,true);
      lVar22 = (long)iVar19 + 0x18;
      puVar14 = auStack_78;
      if ((local_38 == 0) && (puVar14 = auStack_78, this->_premultiply == true)) {
        iVar19 = (this->_header).alphachan;
        uVar1 = (this->_header).nchannels;
        puVar14 = auStack_78;
        if (iVar19 < (int)(uint)uVar1 && -1 < iVar19) {
          PtexUtils::multalpha
                    ((pTVar9->super_TiledFaceBase)._reader,1,(this->_header).datatype,(uint)uVar1,
                     iVar19);
          puVar14 = auStack_78;
        }
      }
    }
    else {
      local_3a.ulog2 = '\0';
      local_3a.vlog2 = '\0';
      readBlock(this,&local_3a,2,true);
      readBlock(this,&local_58,4,true);
      pTVar9 = (TiledFace *)operator_new(0x88);
      TiledFace::TiledFace(pTVar9,this,SUB42(uStack_34,0),local_3a,local_38);
      ppFVar4 = (pTVar9->super_TiledFaceBase)._tiles.
                super__Vector_base<Ptex::v2_2::PtexReader::FaceData_*,_std::allocator<Ptex::v2_2::PtexReader::FaceData_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      pFVar5 = (pTVar9->_fdh).
               super__Vector_base<Ptex::v2_2::FaceDataHeader,_std::allocator<Ptex::v2_2::FaceDataHeader>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      ppFVar6 = (pTVar9->super_TiledFaceBase)._tiles.
                super__Vector_base<Ptex::v2_2::PtexReader::FaceData_*,_std::allocator<Ptex::v2_2::PtexReader::FaceData_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      data = (pTVar9->_fdh).
             super__Vector_base<Ptex::v2_2::FaceDataHeader,_std::allocator<Ptex::v2_2::FaceDataHeader>_>
             ._M_impl.super__Vector_impl_data._M_start;
      readZipBlock(this,data,local_58,(pTVar9->super_TiledFaceBase)._ntiles << 2);
      lVar22 = (long)(pTVar9->super_TiledFaceBase)._ntiles;
      if (lVar22 != 0) {
        plVar7 = (pTVar9->_offsets).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pFVar15 = (pTVar9->_fdh).
                  super__Vector_base<Ptex::v2_2::FaceDataHeader,_std::allocator<Ptex::v2_2::FaceDataHeader>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        FVar17 = this->_pos;
        lVar18 = 0;
        do {
          *(FilePos *)((long)plVar7 + lVar18) = FVar17;
          FVar17 = FVar17 + (ulong)(pFVar15->data & 0x3fffffff);
          pFVar15 = pFVar15 + 1;
          lVar18 = lVar18 + 8;
        } while (lVar22 * 8 != lVar18);
      }
      lVar22 = (long)ppFVar4 +
               (((ulong)((long)pFVar5 - (long)data) >> 2) * 0xc - (long)ppFVar6) + 0x88;
    }
    *local_70 = (FaceData *)pTVar9;
    puVar11 = puVar14;
    if (lVar22 != 0) {
      LOCK();
      this->_memUsed = this->_memUsed + lVar22;
      UNLOCK();
    }
  }
  __mutex = local_60;
  *(undefined8 *)(puVar11 + -8) = 0x113459;
  pthread_mutex_unlock(__mutex);
  return;
}

Assistant:

void PtexReader::readFaceData(FilePos pos, FaceDataHeader fdh, Res res, int levelid,
                              FaceData*& face)
{
    AutoMutex locker(readlock);
    if (face) {
        return;
    }

    // keep new face local until fully initialized
    FaceData* newface = 0;
    size_t newMemUsed = 0;

    seek(pos);
    switch (fdh.encoding()) {
    case enc_constant:
        {
            ConstantFace* cf = new ConstantFace(_pixelsize);
            newface = cf;
            newMemUsed = sizeof(ConstantFace) + _pixelsize;
            readBlock(cf->data(), _pixelsize);
            if (levelid==0 && _premultiply && _header.hasAlpha())
                PtexUtils::multalpha(cf->data(), 1, datatype(),
                                     _header.nchannels, _header.alphachan);
        }
        break;
    case enc_tiled:
        {
            Res tileres;
            readBlock(&tileres, sizeof(tileres));
            uint32_t tileheadersize;
            readBlock(&tileheadersize, sizeof(tileheadersize));
            TiledFace* tf = new TiledFace(this, res, tileres, levelid);
            newface = tf;
            newMemUsed = tf->memUsed();
            readZipBlock(&tf->_fdh[0], tileheadersize, FaceDataHeaderSize * tf->_ntiles);
            computeOffsets(tell(), tf->_ntiles, &tf->_fdh[0], &tf->_offsets[0]);
        }
        break;
    case enc_zipped:
    case enc_diffzipped:
        {
            int uw = res.u(), vw = res.v();
            int npixels = uw * vw;
            int unpackedSize = _pixelsize * npixels;
            PackedFace* pf = new PackedFace(res, _pixelsize, unpackedSize);
            newface = pf;
            newMemUsed = sizeof(PackedFace) + unpackedSize;
            bool useNew = unpackedSize > AllocaMax;
            char* tmp = useNew ? new char [unpackedSize] : (char*) alloca(unpackedSize);
            readZipBlock(tmp, fdh.blocksize(), unpackedSize);
            if (fdh.encoding() == enc_diffzipped)
                PtexUtils::decodeDifference(tmp, unpackedSize, datatype());
            PtexUtils::interleave(tmp, uw * DataSize(datatype()), uw, vw,
                                  pf->data(), uw * _pixelsize,
                                  datatype(), _header.nchannels);
            if (levelid==0 && _premultiply && _header.hasAlpha())
                PtexUtils::multalpha(pf->data(), npixels, datatype(),
                                     _header.nchannels, _header.alphachan);
            if (useNew) delete [] tmp;
        }
        break;
    }

    if (!newface) newface = errorData();

    AtomicStore(&face, newface);
    increaseMemUsed(newMemUsed);
}